

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.hpp
# Opt level: O3

void __thiscall
websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::
proxy_write(connection<websocketpp::config::asio_client::transport_config> *this,
           init_handler *callback)

{
  pointer *ppcVar1;
  basic<websocketpp::concurrency::basic,_websocketpp::log::alevel> *this_00;
  request *this_01;
  element_type *peVar2;
  iterator __position;
  timer_handler *callback_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *stream;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  size_t in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  transfer_all_t local_119;
  undefined1 local_118 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  undefined1 local_f8 [16];
  undefined1 local_e8 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c0;
  element_type *local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  _Alloc_hider local_98;
  size_type sStack_90;
  code *local_88;
  code *pcStack_80;
  element_type *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  _Any_data local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Invoker_type p_Stack_50;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  this_00 = (this->m_alog).
            super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if ((this_00->m_static_channels & 0x400) != 0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              (this_00,0x400,"asio connection proxy_write",in_RCX);
  }
  this_01 = (request *)
            (this->m_proxy_data).
            super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  if (this_01 == (request *)0x0) {
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
              ((this->m_elog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,2,"assertion failed: !m_proxy_data in asio::connection::proxy_write",in_RCX);
    if (error::get_category()::instance == '\0') {
      proxy_write();
    }
    local_f8._0_4_ = 1;
    local_f8._8_8_ = &error::get_category()::instance;
    if ((callback->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*callback->_M_invoker)((_Any_data *)callback,(error_code *)local_f8);
  }
  else {
    http::parser::request::raw_abi_cxx11_((string *)local_f8,this_01);
    std::__cxx11::string::operator=
              ((string *)
               ((this->m_proxy_data).
                super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr + 0x1b8),(string *)local_f8);
    if ((function<void_(const_std::error_code_&)> *)local_f8._0_8_ !=
        (function<void_(const_std::error_code_&)> *)local_e8) {
      operator_delete((void *)local_f8._0_8_,local_e8._0_8_ + 1);
    }
    peVar2 = (this->m_proxy_data).
             super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_f8._0_8_ = *(undefined8 *)(peVar2 + 0x1b8);
    local_f8._8_8_ = *(undefined8 *)(peVar2 + 0x1c0);
    __position._M_current =
         (this->m_bufs).
         super__Vector_base<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_bufs).
        super__Vector_base<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>::
      _M_realloc_insert<boost::asio::const_buffer>
                (&this->m_bufs,__position,(const_buffer *)local_f8);
    }
    else {
      (__position._M_current)->data_ = (void *)local_f8._0_8_;
      (__position._M_current)->size_ = local_f8._8_8_;
      ppcVar1 = &(this->m_bufs).
                 super__Vector_base<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>::write
              ((this->m_alog).
               super___shared_ptr<websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::alevel>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,0x400,
               (this->m_proxy_data).
               super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr + 0x1b8,in_RCX);
    callback_00 = *(timer_handler **)
                   ((this->m_proxy_data).
                    super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x238);
    get_shared((connection<websocketpp::config::asio_client::transport_config> *)(local_118 + 0x10))
    ;
    local_f8._0_8_ = handle_proxy_timeout;
    local_f8._8_8_ = (implementation_type)0x0;
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)local_e8,callback);
    _Var6._M_pi = _Stack_100._M_pi;
    uVar4 = local_118._16_8_;
    local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._16_8_;
    local_c0 = _Stack_100._M_pi;
    local_118._16_8_ = (element_type *)0x0;
    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._M_p = (pointer)0x0;
    sStack_90 = 0;
    local_88 = (code *)0x0;
    pcStack_80 = (code *)0x0;
    local_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&this->m_bufs;
    local_98._M_p = (pointer)operator_new(0x40);
    *(undefined8 *)local_98._M_p = local_f8._0_8_;
    *(undefined8 *)(local_98._M_p + 8) = local_f8._8_8_;
    local_98._M_p[0x10] = '\0';
    local_98._M_p[0x11] = '\0';
    local_98._M_p[0x12] = '\0';
    local_98._M_p[0x13] = '\0';
    local_98._M_p[0x14] = '\0';
    local_98._M_p[0x15] = '\0';
    local_98._M_p[0x16] = '\0';
    local_98._M_p[0x17] = '\0';
    local_98._M_p[0x18] = '\0';
    local_98._M_p[0x19] = '\0';
    local_98._M_p[0x1a] = '\0';
    local_98._M_p[0x1b] = '\0';
    local_98._M_p[0x1c] = '\0';
    local_98._M_p[0x1d] = '\0';
    local_98._M_p[0x1e] = '\0';
    local_98._M_p[0x1f] = '\0';
    local_98._M_p[0x20] = '\0';
    local_98._M_p[0x21] = '\0';
    local_98._M_p[0x22] = '\0';
    local_98._M_p[0x23] = '\0';
    local_98._M_p[0x24] = '\0';
    local_98._M_p[0x25] = '\0';
    local_98._M_p[0x26] = '\0';
    local_98._M_p[0x27] = '\0';
    *(undefined8 *)(local_98._M_p + 0x28) = local_e8._24_8_;
    if ((_Manager_type)local_e8._16_8_ != (_Manager_type)0x0) {
      *(undefined8 *)(local_98._M_p + 0x10) = local_e8._0_8_;
      *(undefined8 *)(local_98._M_p + 0x18) = local_e8._8_8_;
      *(undefined8 *)(local_98._M_p + 0x20) = local_e8._16_8_;
      local_e8._16_8_ = (_Manager_type)0x0;
      local_e8._24_8_ = (_Manager_type)0x0;
    }
    *(undefined8 *)(local_98._M_p + 0x30) = uVar4;
    local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_98._M_p + 0x38) = _Var6._M_pi;
    local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pcStack_80 = std::
                 _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>_>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(const_std::error_code_&),_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_std::error_code_&)>_>
               ::_M_manager;
    set_timer((connection<websocketpp::config::asio_client::transport_config> *)local_118,(long)this
              ,callback_00);
    uVar5 = local_118._8_8_;
    uVar4 = local_118._0_8_;
    peVar2 = (this->m_proxy_data).
             super___shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::proxy_data,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    local_118._0_8_ = (element_type *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_02 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar2 + 0x248);
    *(undefined8 *)(peVar2 + 0x240) = uVar4;
    *(undefined8 *)(peVar2 + 0x248) = uVar5;
    if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
    }
    if (local_88 != (code *)0x0) {
      (*local_88)(&local_98,&local_98,3);
    }
    if (local_c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c0);
    }
    if ((_Manager_type)local_e8._16_8_ != (_Manager_type)0x0) {
      (*(code *)local_e8._16_8_)(local_e8,local_e8,3);
    }
    if (_Stack_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_100._M_pi);
    }
    stream = (this->super_socket_con_type).m_socket.
             super___shared_ptr<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    peVar3 = (this->m_strand).
             super___shared_ptr<boost::asio::io_context::strand,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    get_shared((connection<websocketpp::config::asio_client::transport_config> *)local_118);
    local_78 = (element_type *)handle_proxy_write;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)&local_68,callback);
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_;
    local_b8 = (element_type *)local_118._0_8_;
    local_118._0_8_ = (element_type *)0x0;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_f8._0_8_ = peVar3->service_;
    local_f8._8_8_ = peVar3->impl_;
    local_e8._0_8_ = local_78;
    local_e8._8_8_ = _Stack_70._M_pi;
    local_e8._16_8_ = (_Manager_type)0x0;
    local_e8._24_8_ = (element_type *)0x0;
    local_c8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Stack_50;
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      local_e8._16_8_ = local_68._M_unused._M_object;
      local_e8._24_8_ = local_68._8_8_;
      local_c8 = local_58._M_pi;
      local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_50 = (_Invoker_type)0x0;
    }
    local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._16_8_ =
         (((_Vector_base<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_> *)
          &(local_a0._M_pi)->_vptr__Sp_counted_base)->_M_impl).super__Vector_impl_data._M_start;
    boost::asio::detail::
    start_write_buffer_sequence_op<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,std::vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>>,__gnu_cxx::__normal_iterator<boost::asio::const_buffer_const*,std::vector<boost::asio::const_buffer,std::allocator<boost::asio::const_buffer>>>,boost::asio::detail::transfer_all_t,boost::asio::detail::wrapped_handler<boost::asio::io_context::strand,std::_Bind<void(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>>,std::function<void(std::error_code_const&)>,std::_Placeholder<1>))(std::function<void(std::error_code_const&)>,boost::system::error_code_const&)>,boost::asio::detail::is_continuation_if_running>>
              (stream,(vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>
                       *)local_a0._M_pi,
               (__normal_iterator<const_boost::asio::const_buffer_*,_std::vector<boost::asio::const_buffer,_std::allocator<boost::asio::const_buffer>_>_>
                *)(local_118 + 0x10),&local_119,
               (wrapped_handler<boost::asio::io_context::strand,_std::_Bind<void_(websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>::*(std::shared_ptr<websocketpp::transport::asio::connection<websocketpp::config::asio_client::transport_config>_>,_std::function<void_(const_std::error_code_&)>,_std::_Placeholder<1>))(std::function<void_(const_std::error_code_&)>,_const_boost::system::error_code_&)>,_boost::asio::detail::is_continuation_if_running>
                *)local_f8);
    if (_Stack_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_b0._M_pi);
    }
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_c8)(local_e8 + 0x10,local_e8 + 0x10,3);
    }
    if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    }
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(code *)local_58._M_pi)(&local_68,&local_68,3);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
  }
  return;
}

Assistant:

void proxy_write(init_handler callback) {
        if (m_alog->static_test(log::alevel::devel)) {
            m_alog->write(log::alevel::devel,"asio connection proxy_write");
        }

        if (!m_proxy_data) {
            m_elog->write(log::elevel::library,
                "assertion failed: !m_proxy_data in asio::connection::proxy_write");
            callback(make_error_code(error::general));
            return;
        }

        m_proxy_data->write_buf = m_proxy_data->req.raw();

        m_bufs.push_back(lib::asio::buffer(m_proxy_data->write_buf.data(),
                                           m_proxy_data->write_buf.size()));

        m_alog->write(log::alevel::devel,m_proxy_data->write_buf);

        // Set a timer so we don't wait forever for the proxy to respond
        m_proxy_data->timer = this->set_timer(
            m_proxy_data->timeout_proxy,
            lib::bind(
                &type::handle_proxy_timeout,
                get_shared(),
                callback,
                lib::placeholders::_1
            )
        );

        // Send proxy request
        if (config::enable_multithreading) {
            lib::asio::async_write(
                socket_con_type::get_next_layer(),
                m_bufs,
                m_strand->wrap(lib::bind(
                    &type::handle_proxy_write, get_shared(),
                    callback,
                    lib::placeholders::_1
                ))
            );
        } else {
            lib::asio::async_write(
                socket_con_type::get_next_layer(),
                m_bufs,
                lib::bind(
                    &type::handle_proxy_write, get_shared(),
                    callback,
                    lib::placeholders::_1
                )
            );
        }
    }